

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFilePath.cpp
# Opt level: O1

void __thiscall
de::FilePath::split(FilePath *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *components)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(components,
                    (components->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start);
  uVar2 = (this->m_path)._M_string_length;
  if (1 < uVar2) {
    pcVar3 = (this->m_path)._M_dataplus._M_p;
    cVar1 = *pcVar3;
    if (((cVar1 == '\\') || (cVar1 == '/')) &&
       ((cVar1 = pcVar3[1], cVar1 == '\\' || (cVar1 == '/')))) {
      std::operator+(&local_48,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &separator_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &separator_abi_cxx11_);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)components,
                 &local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0062c4bf;
    }
  }
  if ((uVar2 != 0) &&
     (((cVar1 = *(this->m_path)._M_dataplus._M_p, cVar1 == '\\' || (cVar1 == '/')) &&
      (bVar5 = beginsWithDrive(this), !bVar5)))) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(components,(value_type *)&separator_abi_cxx11_);
  }
LAB_0062c4bf:
  if ((int)(this->m_path)._M_string_length < 1) {
    lVar7 = 0;
    iVar6 = 0;
  }
  else {
    lVar7 = 0;
    iVar6 = 0;
    do {
      cVar1 = (this->m_path)._M_dataplus._M_p[lVar7];
      if ((cVar1 == '\\') || (cVar1 == '/')) {
        iVar4 = (int)lVar7;
        if (iVar4 != iVar6 && -1 < iVar4 - iVar6) {
          std::__cxx11::string::substr((ulong)&local_48,(ulong)this);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)components
                     ,&local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p != &local_48.field_2) {
            operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
          }
        }
        iVar6 = iVar4 + 1;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < (int)(this->m_path)._M_string_length);
  }
  if (0 < (int)lVar7 - iVar6) {
    std::__cxx11::string::substr((ulong)&local_48,(ulong)this);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)components,
               &local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void FilePath::split (std::vector<std::string>& components) const
{
	components.clear();

	int curCompStart = 0;
	int pos;

	if (isWinNetPath())
		components.push_back(separator + separator);
	else if (isRootPath() && !beginsWithDrive())
		components.push_back(separator);

	for (pos = 0; pos < (int)m_path.length(); pos++)
	{
		const char c = m_path[pos];

		if (isSeparator(c))
		{
			if (pos - curCompStart > 0)
				components.push_back(m_path.substr(curCompStart, pos - curCompStart));

			curCompStart = pos+1;
		}
	}

	if (pos - curCompStart > 0)
		components.push_back(m_path.substr(curCompStart, pos - curCompStart));
}